

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fse_compress.c
# Opt level: O3

size_t FSE_compress_usingCTable_generic
                 (void *dst,size_t dstSize,void *src,size_t srcSize,FSE_CTable *ct,uint fast)

{
  byte *pbVar1;
  byte *pbVar2;
  ulong *puVar3;
  ushort uVar4;
  ushort uVar5;
  long lVar6;
  int iVar7;
  uint uVar8;
  int iVar9;
  ulong *puVar10;
  size_t sVar11;
  uint uVar12;
  int iVar13;
  BYTE *istart;
  ushort uVar14;
  long lVar16;
  ulong uVar17;
  ulong uVar18;
  ulong uVar19;
  ulong uVar20;
  ulong uVar21;
  ulong *puVar22;
  ulong *puVar23;
  ulong uVar24;
  ushort uVar25;
  void *pvVar26;
  ulong uVar15;
  
  if ((2 < srcSize) && (8 < dstSize)) {
    puVar3 = (ulong *)((long)dst + (dstSize - 8));
    uVar24 = (ulong)*(byte *)((long)src + (srcSize - 1));
    uVar4 = (ushort)*ct;
    lVar16 = 1;
    if (uVar4 != 0) {
      lVar16 = (long)(1 << ((char)uVar4 - 1U & 0x1f));
    }
    uVar12 = ct[lVar16 + uVar24 * 2 + 2] + 0x8000;
    uVar5 = *(ushort *)
             ((long)ct +
             (long)(int)ct[lVar16 + uVar24 * 2 + 1] * 2 +
             (ulong)((uVar12 & 0xffff0000) - ct[lVar16 + uVar24 * 2 + 2] >>
                    ((byte)(uVar12 >> 0x10) & 0x3f)) * 2 + 4);
    if ((srcSize & 1) == 0) {
      uVar24 = (ulong)*(byte *)((long)src + (srcSize - 2));
      lVar6 = srcSize - 2;
      uVar12 = ct[lVar16 + uVar24 * 2 + 2] + 0x8000;
      uVar25 = *(ushort *)
                ((long)ct +
                (long)(int)ct[lVar16 + uVar24 * 2 + 1] * 2 +
                (ulong)((uVar12 & 0xffff0000) - ct[lVar16 + uVar24 * 2 + 2] >>
                       ((byte)(uVar12 >> 0x10) & 0x3f)) * 2 + 4);
      uVar24 = 0;
      uVar8 = 0;
      puVar23 = (ulong *)dst;
      uVar14 = uVar5;
    }
    else {
      uVar24 = (ulong)*(byte *)((long)src + (srcSize - 2));
      uVar12 = ct[lVar16 + uVar24 * 2 + 2] + 0x8000;
      uVar14 = *(ushort *)
                ((long)ct +
                (long)(int)ct[lVar16 + uVar24 * 2 + 1] * 2 +
                (ulong)((uVar12 & 0xffff0000) - ct[lVar16 + uVar24 * 2 + 2] >>
                       ((byte)(uVar12 >> 0x10) & 0x3f)) * 2 + 4);
      uVar15 = (ulong)*(byte *)((long)src + (srcSize - 3));
      uVar24 = (ulong)ct[lVar16 + uVar15 * 2 + 2] + (ulong)uVar5;
      uVar12 = BIT_mask[uVar24 >> 0x10];
      lVar6 = srcSize - 3;
      uVar25 = *(ushort *)
                ((long)ct +
                (long)(int)ct[lVar16 + uVar15 * 2 + 1] * 2 +
                (ulong)(uVar5 >> ((byte)(uVar24 >> 0x10) & 0x3f)) * 2 + 4);
      puVar23 = (ulong *)((long)dst + (uVar24 >> 0x13));
      *(ulong *)dst = (ulong)(uVar12 & uVar5);
      if ((fast == 0) && (puVar3 < puVar23)) {
        puVar23 = puVar3;
      }
      uVar8 = (uint)(uVar24 >> 0x10) & 7;
      uVar24 = (ulong)((uVar12 & uVar5) >> ((byte)((int)(uVar24 >> 0x13) << 3) & 0x3f));
    }
    pvVar26 = (void *)((long)src + lVar6);
    uVar15 = (ulong)uVar14;
    uVar18 = (ulong)uVar25;
    if ((srcSize & 2) == 0) {
      uVar17 = ct[lVar16 + (ulong)*(byte *)((long)pvVar26 - 1) * 2 + 2] + uVar15;
      iVar7 = uVar8 + (int)(uVar17 >> 0x10);
      uVar15 = (ulong)*(ushort *)
                       ((long)ct +
                       (long)(int)ct[lVar16 + (ulong)*(byte *)((long)pvVar26 - 1) * 2 + 1] * 2 +
                       (ulong)(uVar14 >> ((byte)(uVar17 >> 0x10) & 0x3f)) * 2 + 4);
      pbVar1 = (byte *)((long)pvVar26 - 2);
      uVar18 = ct[lVar16 + (ulong)*pbVar1 * 2 + 2] + uVar18;
      pvVar26 = (void *)((long)pvVar26 - 2);
      uVar24 = (ulong)(BIT_mask[uVar18 >> 0x10] & (uint)uVar25) << ((byte)iVar7 & 0x3f) |
               (ulong)(BIT_mask[uVar17 >> 0x10] & (uint)uVar14) << (sbyte)uVar8 | uVar24;
      uVar8 = iVar7 + (int)(uVar18 >> 0x10);
      uVar18 = (ulong)*(ushort *)
                       ((long)ct +
                       (long)(int)ct[lVar16 + (ulong)*pbVar1 * 2 + 1] * 2 +
                       (ulong)(uVar25 >> ((byte)(uVar18 >> 0x10) & 0x3f)) * 2 + 4);
      uVar12 = uVar8 >> 3;
      puVar22 = (ulong *)((long)puVar23 + (ulong)uVar12);
      *puVar23 = uVar24;
      puVar23 = puVar22;
      if ((fast == 0) && (puVar3 < puVar22)) {
        puVar23 = puVar3;
      }
      uVar8 = uVar8 & 7;
      uVar24 = uVar24 >> ((byte)(uVar12 << 3) & 0x3f);
    }
    while( true ) {
      if (pvVar26 <= src) break;
      uVar19 = ct[lVar16 + (ulong)*(byte *)((long)pvVar26 - 1) * 2 + 2] + uVar15;
      iVar7 = uVar8 + (int)(uVar19 >> 0x10);
      uVar5 = *(ushort *)
               ((long)ct +
               (long)(int)ct[lVar16 + (ulong)*(byte *)((long)pvVar26 - 1) * 2 + 1] * 2 +
               (uVar15 >> ((byte)(uVar19 >> 0x10) & 0x3f)) * 2 + 4);
      uVar20 = ct[lVar16 + (ulong)*(byte *)((long)pvVar26 - 2) * 2 + 2] + uVar18;
      iVar9 = iVar7 + (int)(uVar20 >> 0x10);
      uVar25 = *(ushort *)
                ((long)ct +
                (long)(int)ct[lVar16 + (ulong)*(byte *)((long)pvVar26 - 2) * 2 + 1] * 2 +
                (uVar18 >> ((byte)(uVar20 >> 0x10) & 0x3f)) * 2 + 4);
      pbVar1 = (byte *)((long)pvVar26 - 3);
      uVar21 = (ulong)ct[lVar16 + (ulong)*pbVar1 * 2 + 2] + (ulong)uVar5;
      iVar13 = (int)(uVar21 >> 0x10) + iVar9;
      pbVar2 = (byte *)((long)pvVar26 - 4);
      uVar17 = (ulong)ct[lVar16 + (ulong)*pbVar2 * 2 + 2] + (ulong)uVar25;
      uVar24 = (ulong)((uint)uVar25 & BIT_mask[uVar17 >> 0x10]) << ((byte)iVar13 & 0x3f) |
               (ulong)((uint)uVar5 & BIT_mask[uVar21 >> 0x10]) << ((byte)iVar9 & 0x3f) |
               (ulong)(BIT_mask[uVar20 >> 0x10] & (uint)uVar18) << ((byte)iVar7 & 0x3f) |
               (ulong)(BIT_mask[uVar19 >> 0x10] & (uint)uVar15) << (sbyte)uVar8 | uVar24;
      pvVar26 = (void *)((long)pvVar26 - 4);
      uVar8 = (int)(uVar17 >> 0x10) + iVar13;
      puVar10 = (ulong *)((ulong)(uVar8 >> 3) + (long)puVar23);
      uVar15 = (ulong)*(ushort *)
                       ((long)ct +
                       (long)(int)ct[lVar16 + (ulong)*pbVar1 * 2 + 1] * 2 +
                       (ulong)(uVar5 >> ((byte)(uVar21 >> 0x10) & 0x3f)) * 2 + 4);
      puVar22 = puVar10;
      if (puVar3 < puVar10) {
        puVar22 = puVar3;
      }
      if (fast != 0) {
        puVar22 = puVar10;
      }
      uVar18 = (ulong)*(ushort *)
                       ((long)ct +
                       (long)(int)ct[lVar16 + (ulong)*pbVar2 * 2 + 1] * 2 +
                       (ulong)(uVar25 >> ((byte)(uVar17 >> 0x10) & 0x3f)) * 2 + 4);
      *puVar23 = uVar24;
      uVar24 = uVar24 >> ((byte)uVar8 & 0x38);
      uVar8 = uVar8 & 7;
      puVar23 = puVar22;
    }
    uVar12 = BIT_mask[uVar4];
    uVar24 = (ulong)((uint)uVar15 & uVar12) << (sbyte)uVar8 | uVar24;
    uVar8 = uVar8 + uVar4;
    puVar22 = (ulong *)((ulong)(uVar8 >> 3) + (long)puVar23);
    if (puVar3 < puVar22) {
      puVar22 = puVar3;
    }
    *puVar23 = uVar24;
    uVar24 = (ulong)((uint)uVar18 & uVar12) << (sbyte)(uVar8 & 7) | uVar24 >> ((byte)uVar8 & 0x38);
    uVar12 = (uVar8 & 7) + (uint)uVar4;
    puVar23 = (ulong *)((ulong)(uVar12 >> 3) + (long)puVar22);
    if (puVar3 < puVar23) {
      puVar23 = puVar3;
    }
    *puVar22 = uVar24;
    uVar8 = (uVar12 & 7) + 1;
    *puVar23 = uVar24 >> ((byte)uVar12 & 0x38) | 1L << (uVar12 & 7);
    puVar23 = (ulong *)((ulong)(uVar8 >> 3) + (long)puVar23);
    if (puVar3 < puVar23) {
      puVar23 = puVar3;
    }
    if (puVar23 < puVar3) {
      sVar11 = (long)puVar23 - ((long)dst + ((ulong)((uVar8 & 7) == 0) - 1));
    }
    else {
      sVar11 = 0;
    }
    return sVar11;
  }
  return 0;
}

Assistant:

static size_t FSE_compress_usingCTable_generic (void* dst, size_t dstSize,
                           const void* src, size_t srcSize,
                           const FSE_CTable* ct, const unsigned fast)
{
    const BYTE* const istart = (const BYTE*) src;
    const BYTE* const iend = istart + srcSize;
    const BYTE* ip=iend;

    BIT_CStream_t bitC;
    FSE_CState_t CState1, CState2;

    /* init */
    if (srcSize <= 2) return 0;
    { size_t const initError = BIT_initCStream(&bitC, dst, dstSize);
      if (FSE_isError(initError)) return 0; /* not enough space available to write a bitstream */ }

#define FSE_FLUSHBITS(s)  (fast ? BIT_flushBitsFast(s) : BIT_flushBits(s))

    if (srcSize & 1) {
        FSE_initCState2(&CState1, ct, *--ip);
        FSE_initCState2(&CState2, ct, *--ip);
        FSE_encodeSymbol(&bitC, &CState1, *--ip);
        FSE_FLUSHBITS(&bitC);
    } else {
        FSE_initCState2(&CState2, ct, *--ip);
        FSE_initCState2(&CState1, ct, *--ip);
    }

    /* join to mod 4 */
    srcSize -= 2;
    if ((sizeof(bitC.bitContainer)*8 > FSE_MAX_TABLELOG*4+7 ) && (srcSize & 2)) {  /* test bit 2 */
        FSE_encodeSymbol(&bitC, &CState2, *--ip);
        FSE_encodeSymbol(&bitC, &CState1, *--ip);
        FSE_FLUSHBITS(&bitC);
    }

    /* 2 or 4 encoding per loop */
    while ( ip>istart ) {

        FSE_encodeSymbol(&bitC, &CState2, *--ip);

        if (sizeof(bitC.bitContainer)*8 < FSE_MAX_TABLELOG*2+7 )   /* this test must be static */
            FSE_FLUSHBITS(&bitC);

        FSE_encodeSymbol(&bitC, &CState1, *--ip);

        if (sizeof(bitC.bitContainer)*8 > FSE_MAX_TABLELOG*4+7 ) {  /* this test must be static */
            FSE_encodeSymbol(&bitC, &CState2, *--ip);
            FSE_encodeSymbol(&bitC, &CState1, *--ip);
        }

        FSE_FLUSHBITS(&bitC);
    }

    FSE_flushCState(&bitC, &CState2);
    FSE_flushCState(&bitC, &CState1);
    return BIT_closeCStream(&bitC);
}